

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trace.h
# Opt level: O0

void NULLC::TraceLabel(char *begin,char *end)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  uint *puVar4;
  TraceEvent *traceEvent;
  uint token;
  uint count;
  TraceContext *context;
  char *end_local;
  char *begin_local;
  
  lVar2 = traceContext;
  uVar3 = (int)end - (int)begin;
  if (uVar3 != 0) {
    if ((*(uint *)(traceContext + 0x264) <= *(int *)(traceContext + 0x260) + uVar3 + 1) ||
       (*(int *)(traceContext + 0x270) == *(int *)(traceContext + 0x274))) {
      TraceDump();
    }
    if (*(uint *)(lVar2 + 0x264) <= uVar3 + 1) {
      __assert_fail("count + 1 < context.labels.max",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Trace.h"
                    ,0x142,"void NULLC::TraceLabel(const char *, const char *)");
    }
    iVar1 = *(int *)(lVar2 + 0x260);
    memcpy((void *)(*(long *)(lVar2 + 0x268) + (ulong)*(uint *)(lVar2 + 0x260)),begin,(ulong)uVar3);
    *(undefined1 *)(*(long *)(lVar2 + 0x268) + (ulong)(*(int *)(lVar2 + 0x260) + uVar3)) = 0;
    *(uint *)(lVar2 + 0x260) = uVar3 + 1 + *(int *)(lVar2 + 0x260);
    uVar3 = *(uint *)(lVar2 + 0x270);
    *(uint *)(lVar2 + 0x270) = uVar3 + 1;
    puVar4 = (uint *)(*(long *)(lVar2 + 0x278) + (ulong)uVar3 * 8);
    *puVar4 = *puVar4 & 0xfffffffe;
    *puVar4 = *puVar4 & 0xfffffffd | 2;
    *puVar4 = *puVar4 & 3 | iVar1 << 2;
    puVar4[1] = 0;
  }
  return;
}

Assistant:

inline void TraceLabel(const char *begin, const char *end)
	{
		TraceContext &context = *traceContext;

		unsigned count = unsigned(end - begin);

		if(!count)
			return;

		if(context.labels.count + count + 1 >= context.labels.max || context.events.count == context.events.max)
			TraceDump();

		assert(count + 1 < context.labels.max);

		unsigned token = context.labels.count;

		memcpy(&context.labels.data[context.labels.count], begin, count);
		context.labels.data[context.labels.count + count] = 0;
		context.labels.count += count + 1;

		TraceEvent &traceEvent = context.events.data[context.events.count++];

		traceEvent.isEnter = false;
		traceEvent.isLabel = true;
		traceEvent.token = token;
		traceEvent.ts = 0;
	}